

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httpreadwrite.c
# Opt level: O1

int http_MakeHttpRequest
              (Upnp_HttpMethod method,char *url_str,void *Handle,UpnpString *headers,
              char *contentType,int contentLength,int timeout)

{
  int iVar1;
  uri_type url;
  membuffer local_110;
  uri_type local_f0;
  
  iVar1 = -0x65;
  if (Handle != (void *)0x0 && url_str != (char *)0x0) {
    *(undefined8 *)((long)Handle + 0x280) = 1;
    iVar1 = MakeGenericMessage(method,url_str,&local_110,&local_f0,contentLength,contentType,headers
                              );
    if (iVar1 == 0) {
      iVar1 = http_SendMessage((SOCKINFO *)Handle,&timeout,"b",local_110.buf,local_110.length);
      membuffer_destroy(&local_110);
      httpmsg_destroy((http_message_t *)((long)Handle + 0x90));
      parser_response_init((http_parser_t *)((long)Handle + 0x90),method);
    }
  }
  return iVar1;
}

Assistant:

int http_MakeHttpRequest(Upnp_HttpMethod method,
	const char *url_str,
	void *Handle,
	UpnpString *headers,
	const char *contentType,
	int contentLength,
	int timeout)
{
	int ret_code;
	membuffer request;
	http_connection_handle_t *handle = Handle;
	uri_type url;
	if (!url_str || !Handle)
		return UPNP_E_INVALID_PARAM;
	if (handle->requestStarted) {
		/* TODO: Log an error that a previous request is already in
		 * progress. */
	}
	handle->requestStarted = 1;
	handle->cancel = 0;
	ret_code = MakeGenericMessage((http_method_t)method,
		url_str,
		&request,
		&url,
		contentLength,
		contentType,
		headers);
	if (ret_code != UPNP_E_SUCCESS)
		return ret_code;
	/* send request */
	ret_code = http_SendMessage(
		&handle->sock_info, &timeout, "b", request.buf, request.length);
	membuffer_destroy(&request);
	httpmsg_destroy(&handle->response.msg);
	parser_response_init(&handle->response, (http_method_t)method);
	return ret_code;
}